

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UBool __thiscall
icu_63::ICUService::unregister(ICUService *this,URegistryKey rkey,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  
  if ((rkey == (URegistryKey)0x0) || (this->factories == (UVector *)0x0)) {
    bVar2 = false;
  }
  else {
    umtx_lock_63((UMutex *)lock);
    UVar1 = UVector::removeElement(this->factories,rkey);
    if (UVar1 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      (**(code **)(*rkey + 8))(rkey);
    }
    else {
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
    }
    bVar2 = UVar1 != '\0';
    umtx_unlock_63((UMutex *)lock);
  }
  if (bVar2 != false) {
    (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])(this);
  }
  return bVar2;
}

Assistant:

UBool 
ICUService::unregister(URegistryKey rkey, UErrorCode& status) 
{
    ICUServiceFactory *factory = (ICUServiceFactory*)rkey;
    UBool result = FALSE;
    if (factory != NULL && factories != NULL) {
        Mutex mutex(&lock);

        if (factories->removeElement(factory)) {
            clearCaches();
            result = TRUE;
        } else {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            delete factory;
        }
    }
    if (result) {
        notifyChanged();
    }
    return result;
}